

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O1

void __thiscall
QCommandLineOption::setDefaultValues(QCommandLineOption *this,QStringList *defaultValues)

{
  QCommandLineOptionPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QCommandLineOptionPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QCommandLineOptionPrivate>::detach_helper(&this->d);
  }
  QArrayDataPointer<QString>::operator=(&(((this->d).d.ptr)->defaultValues).d,&defaultValues->d);
  return;
}

Assistant:

void QCommandLineOption::setDefaultValues(const QStringList &defaultValues)
{
    d->defaultValues = defaultValues;
}